

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O3

void test_save_and_load<QDateTime>(QDateTime *userValue)

{
  QDateTime *this;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  QString local_e8;
  Format local_cc;
  SimpleConfig<QDateTime> config2;
  SimpleConfig<QDateTime> config1;
  
  SimpleConfig<QDateTime>::SimpleConfig(&config1);
  this = &config1.value;
  QDateTime::operator=(this,userValue);
  config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)0x0;
  config2.super_MConfig.super_MBaseConfig.m_groupName.d.d = (Data *)0x0;
  config2.super_MConfig.super_MBaseConfig.m_groupName.d.ptr = (char *)0x0;
  local_e8.d.d = (Data *)CONCAT44(local_e8.d.d._4_4_,1);
  MBaseConfig::save((MBaseConfig *)&config1,(QString *)&config2,(Format *)&local_e8);
  if (config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig != (_func_int **)0x0) {
    LOCK();
    *(int *)config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig =
         *(int *)config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig + -1;
    UNLOCK();
    if (*(int *)config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig == 0) {
      QArrayData::deallocate
                ((QArrayData *)config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig,2,8);
    }
  }
  SimpleConfig<QDateTime>::SimpleConfig(&config2);
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
  local_cc = IniFormat;
  MBaseConfig::load((MBaseConfig *)&config2,&local_e8,&local_cc);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  bVar1 = (bool)QDateTime::equals(this);
  pcVar2 = QTest::toString<QDateTime>(this);
  pcVar3 = QTest::toString<QDateTime>(&config2.value);
  QTest::compare_helper
            (bVar1,"Compared values are not the same",pcVar2,pcVar3,"config1.value","config2.value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
             ,0x5b);
  config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig =
       (_func_int **)&PTR__SimpleConfig_0010dc60;
  QDateTime::~QDateTime(&config2.value);
  config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)&PTR__MConfig_0010dd50;
  QHash<QByteArray,_MConfig::ValuePtr>::~QHash(&config2.super_MConfig.mValues);
  MBaseConfig::~MBaseConfig((MBaseConfig *)&config2);
  config1.super_MConfig.super_MBaseConfig._vptr_MBaseConfig =
       (_func_int **)&PTR__SimpleConfig_0010dc60;
  QDateTime::~QDateTime(this);
  config1.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)&PTR__MConfig_0010dd50;
  QHash<QByteArray,_MConfig::ValuePtr>::~QHash(&config1.super_MConfig.mValues);
  MBaseConfig::~MBaseConfig((MBaseConfig *)&config1);
  return;
}

Assistant:

void test_save_and_load(T userValue)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save();
    SimpleConfig<T> config2;
    config2.load();
    QCOMPARE(config1.value, config2.value);
}